

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundary_element.cpp
# Opt level: O0

void __thiscall BoundaryElement::upward_pass(BoundaryElement *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  value_type_conflict2 vVar4;
  ulong uVar5;
  int iVar6;
  size_type sVar7;
  reference pvVar8;
  size_t sVar9;
  reference pvVar10;
  int *piVar11;
  int *piVar12;
  int *piVar13;
  double *pdVar14;
  long lVar15;
  long in_RDI;
  undefined1 *puVar16;
  double extraout_XMM0_Qa;
  double dVar17;
  Tree *extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  array<unsigned_long,_2UL> aVar18;
  double numerator;
  double dist_z_1;
  double dist_y_1;
  double dist_x_1;
  size_t i_3;
  double q_dz_temp;
  double q_dy_temp;
  double q_dx_temp;
  double q_temp;
  double w3;
  double cz;
  double w2;
  double cy;
  double w1;
  double cx;
  size_t kk;
  int k3;
  int k2;
  int k1;
  double dist_z;
  double dist_y;
  double dist_x;
  int j;
  double zz;
  double yy;
  double xx;
  double denominator_z;
  double denominator_y;
  double denominator_x;
  size_t i_2;
  size_t i_1;
  double *denominator_ptr;
  int *exact_idx_z_ptr;
  int *exact_idx_y_ptr;
  int *exact_idx_x_ptr;
  vector<double,_std::allocator<double>_> denominator;
  vector<int,_std::allocator<int>_> exact_idx_z;
  vector<int,_std::allocator<int>_> exact_idx_y;
  vector<int,_std::allocator<int>_> exact_idx_x;
  size_t num_particles;
  size_t particle_start;
  size_t node_charges_start;
  size_t node_interp_pts_start;
  array<unsigned_long,_2UL> particle_idxs;
  size_t node_idx;
  int num_interp_pts_per_node;
  int i;
  int weights_num;
  double *weights_ptr;
  vector<double,_std::allocator<double>_> weights;
  double *sources_q_dz_ptr;
  double *sources_q_dy_ptr;
  double *sources_q_dx_ptr;
  double *sources_q_ptr;
  double *elements_z_ptr;
  double *elements_y_ptr;
  double *elements_x_ptr;
  double *clusters_q_dz_ptr;
  double *clusters_q_dy_ptr;
  double *clusters_q_dx_ptr;
  double *clusters_q_ptr;
  double *clusters_z_ptr;
  double *clusters_y_ptr;
  double *clusters_x_ptr;
  double in_stack_fffffffffffffca8;
  Tree *in_stack_fffffffffffffcb0;
  Timer *in_stack_fffffffffffffcc0;
  undefined1 *in_stack_fffffffffffffcc8;
  Timer *in_stack_fffffffffffffcd0;
  double local_288;
  Timer *local_268;
  double local_260;
  double local_258;
  double local_250;
  double local_248;
  int local_204;
  int local_200;
  int local_1fc;
  int local_1dc;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  Timer *local_1a8;
  Timer *local_1a0;
  undefined1 local_171;
  undefined1 local_170 [120];
  Timer *local_f8;
  value_type_conflict2 local_f0;
  long local_e8;
  long local_e0;
  _Type local_d8;
  ulong local_c8;
  int local_bc;
  int local_b8;
  int local_b4;
  double *local_b0;
  vector<double,_std::allocator<double>_> local_90;
  double *local_78;
  double *local_70;
  double *local_68;
  double *local_60;
  double *local_58;
  double *local_50;
  double *local_48;
  double *local_40;
  double *local_38;
  double *local_30;
  double *local_28;
  double *local_20;
  double *local_18;
  double *local_10;
  
  Timer::start((Timer *)in_stack_fffffffffffffcb0);
  local_10 = InterpolationPoints::interp_x_ptr((InterpolationPoints *)0x125ab0);
  local_18 = InterpolationPoints::interp_y_ptr((InterpolationPoints *)0x125acc);
  local_20 = InterpolationPoints::interp_z_ptr((InterpolationPoints *)0x125ae8);
  local_28 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x125b01);
  local_30 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x125b1a);
  local_38 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x125b36);
  local_40 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x125b52);
  local_48 = Particles::x_ptr((Particles *)0x125b6d);
  local_50 = Particles::y_ptr((Particles *)0x125b88);
  local_58 = Particles::z_ptr((Particles *)0x125ba3);
  local_60 = Elements::source_charge_ptr((Elements *)0x125bbe);
  local_68 = Elements::source_charge_dx_ptr((Elements *)0x125bd9);
  local_70 = Elements::source_charge_dy_ptr((Elements *)0x125bf4);
  local_78 = Elements::source_charge_dz_ptr((Elements *)0x125c0f);
  InterpolationPoints::num_interp_pts_per_node(*(InterpolationPoints **)(in_RDI + 8));
  std::allocator<double>::allocator((allocator<double> *)0x125c48);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffcd0,
             (size_type)in_stack_fffffffffffffcc8,(allocator_type *)in_stack_fffffffffffffcc0);
  std::allocator<double>::~allocator((allocator<double> *)0x125c74);
  local_b0 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x125c81);
  sVar7 = std::vector<double,_std::allocator<double>_>::size(&local_90);
  local_b4 = (int)sVar7;
  for (local_b8 = 0; local_b8 < local_b4; local_b8 = local_b8 + 1) {
    iVar6 = -1;
    if (local_b8 % 2 == 0) {
      iVar6 = 1;
    }
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,(long)local_b8);
    *pvVar8 = (double)iVar6;
    if ((local_b8 == 0) || (local_b8 == local_b4 + -1)) {
      iVar6 = -1;
      if (local_b8 % 2 == 0) {
        iVar6 = 1;
      }
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,(long)local_b8);
      *pvVar8 = (double)iVar6 * 0.5;
    }
  }
  sVar9 = InterpolationPoints::num_interp_pts_per_node(*(InterpolationPoints **)(in_RDI + 8));
  local_bc = (int)sVar9;
  local_c8 = 0;
  while( true ) {
    uVar5 = local_c8;
    sVar9 = Tree::num_nodes(*(Tree **)(in_RDI + 0x10));
    if (sVar9 <= uVar5) break;
    aVar18 = Tree::node_particle_idxs(in_stack_fffffffffffffcb0,(size_t)in_stack_fffffffffffffca8);
    uVar5 = local_c8;
    local_d8 = aVar18._M_elems;
    sVar9 = InterpolationPoints::num_interp_pts_per_node(*(InterpolationPoints **)(in_RDI + 8));
    local_e0 = uVar5 * sVar9;
    local_e8 = local_c8 * (long)*(int *)(in_RDI + 0x58);
    pvVar10 = std::array<unsigned_long,_2UL>::operator[]
                        ((array<unsigned_long,_2UL> *)in_stack_fffffffffffffcb0,
                         (size_type)in_stack_fffffffffffffca8);
    local_f0 = *pvVar10;
    pvVar10 = std::array<unsigned_long,_2UL>::operator[]
                        ((array<unsigned_long,_2UL> *)in_stack_fffffffffffffcb0,
                         (size_type)in_stack_fffffffffffffca8);
    vVar4 = *pvVar10;
    pvVar10 = std::array<unsigned_long,_2UL>::operator[]
                        ((array<unsigned_long,_2UL> *)in_stack_fffffffffffffcb0,
                         (size_type)in_stack_fffffffffffffca8);
    local_f8 = (Timer *)(vVar4 - *pvVar10);
    std::allocator<int>::allocator((allocator<int> *)0x125f68);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcd0,
               (size_type)in_stack_fffffffffffffcc8,(allocator_type *)in_stack_fffffffffffffcc0);
    std::allocator<int>::~allocator((allocator<int> *)0x125f8e);
    std::allocator<int>::allocator((allocator<int> *)0x125fad);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcd0,
               (size_type)in_stack_fffffffffffffcc8,(allocator_type *)in_stack_fffffffffffffcc0);
    std::allocator<int>::~allocator((allocator<int> *)0x125fd3);
    in_stack_fffffffffffffcd0 = local_f8;
    std::allocator<int>::allocator((allocator<int> *)0x125ff2);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcd0,
               (size_type)in_stack_fffffffffffffcc8,(allocator_type *)in_stack_fffffffffffffcc0);
    std::allocator<int>::~allocator((allocator<int> *)0x126018);
    in_stack_fffffffffffffcc8 = &local_171;
    in_stack_fffffffffffffcc0 = local_f8;
    std::allocator<double>::allocator((allocator<double> *)0x126037);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffcd0,
               (size_type)in_stack_fffffffffffffcc8,(allocator_type *)in_stack_fffffffffffffcc0);
    std::allocator<double>::~allocator((allocator<double> *)0x12605d);
    piVar11 = std::vector<int,_std::allocator<int>_>::data
                        ((vector<int,_std::allocator<int>_> *)0x12606a);
    piVar12 = std::vector<int,_std::allocator<int>_>::data
                        ((vector<int,_std::allocator<int>_> *)0x12607f);
    piVar13 = std::vector<int,_std::allocator<int>_>::data
                        ((vector<int,_std::allocator<int>_> *)0x126094);
    puVar16 = local_170;
    pdVar14 = std::vector<double,_std::allocator<double>_>::data
                        ((vector<double,_std::allocator<double>_> *)0x1260a9);
    for (local_1a0 = (Timer *)0x0; local_1a0 < local_f8;
        local_1a0 = (Timer *)((long)&(local_1a0->start_time_).__d.__r + 1)) {
      piVar11[(long)local_1a0] = -1;
      piVar12[(long)local_1a0] = -1;
      piVar13[(long)local_1a0] = -1;
    }
    for (local_1a8 = (Timer *)0x0; local_1a8 < local_f8;
        local_1a8 = (Timer *)((long)&(local_1a8->start_time_).__d.__r + 1)) {
      local_1b0 = 0.0;
      local_1b8 = 0.0;
      local_1c0 = 0.0;
      dVar1 = local_48[(long)&(local_1a8->start_time_).__d.__r + local_f0];
      dVar2 = local_50[(long)&(local_1a8->start_time_).__d.__r + local_f0];
      dVar3 = local_58[(long)&(local_1a8->start_time_).__d.__r + local_f0];
      for (local_1dc = 0; local_1dc < local_bc; local_1dc = local_1dc + 1) {
        local_1b0 = local_1b0 + local_b0[local_1dc] / (dVar1 - local_10[local_e0 + local_1dc]);
        local_1b8 = local_1b8 + local_b0[local_1dc] / (dVar2 - local_18[local_e0 + local_1dc]);
        local_1c0 = local_1c0 + local_b0[local_1dc] / (dVar3 - local_20[local_e0 + local_1dc]);
        std::abs((int)puVar16);
        dVar17 = std::numeric_limits<double>::min();
        if (extraout_XMM0_Qa < dVar17) {
          piVar11[(long)local_1a8] = local_1dc;
        }
        std::abs((int)puVar16);
        in_stack_fffffffffffffcb0 = extraout_XMM0_Qa_00;
        dVar17 = std::numeric_limits<double>::min();
        if ((double)in_stack_fffffffffffffcb0 < dVar17) {
          piVar12[(long)local_1a8] = local_1dc;
        }
        std::abs((int)puVar16);
        in_stack_fffffffffffffca8 = extraout_XMM0_Qa_01;
        dVar17 = std::numeric_limits<double>::min();
        if (in_stack_fffffffffffffca8 < dVar17) {
          piVar13[(long)local_1a8] = local_1dc;
        }
      }
      pdVar14[(long)local_1a8] = 1.0;
      if (piVar11[(long)local_1a8] == -1) {
        pdVar14[(long)local_1a8] = pdVar14[(long)local_1a8] / local_1b0;
      }
      if (piVar12[(long)local_1a8] == -1) {
        pdVar14[(long)local_1a8] = pdVar14[(long)local_1a8] / local_1b8;
      }
      if (piVar13[(long)local_1a8] == -1) {
        pdVar14[(long)local_1a8] = pdVar14[(long)local_1a8] / local_1c0;
      }
    }
    for (local_1fc = 0; local_1fc < local_bc; local_1fc = local_1fc + 1) {
      for (local_200 = 0; local_200 < local_bc; local_200 = local_200 + 1) {
        for (local_204 = 0; local_204 < local_bc; local_204 = local_204 + 1) {
          lVar15 = local_e8 + local_1fc * local_bc * local_bc + (long)(local_200 * local_bc) +
                   (long)local_204;
          local_248 = 0.0;
          local_250 = 0.0;
          local_258 = 0.0;
          local_260 = 0.0;
          for (local_268 = (Timer *)0x0; local_268 < local_f8;
              local_268 = (Timer *)((long)&(local_268->start_time_).__d.__r + 1)) {
            local_288 = 1.0;
            if (piVar11[(long)local_268] == -1) {
              local_288 = (local_b0[local_1fc] /
                          (local_48[(long)&(local_268->start_time_).__d.__r + local_f0] -
                          local_10[local_e0 + local_1fc])) * 1.0;
            }
            else if (piVar11[(long)local_268] != local_1fc) {
              local_288 = 0.0;
            }
            if (piVar12[(long)local_268] == -1) {
              local_288 = (local_b0[local_200] /
                          (local_50[(long)&(local_268->start_time_).__d.__r + local_f0] -
                          local_18[local_e0 + local_200])) * local_288;
            }
            else if (piVar12[(long)local_268] != local_200) {
              local_288 = local_288 * 0.0;
            }
            if (piVar13[(long)local_268] == -1) {
              local_288 = (local_b0[local_204] /
                          (local_58[(long)&(local_268->start_time_).__d.__r + local_f0] -
                          local_20[local_e0 + local_204])) * local_288;
            }
            else if (piVar13[(long)local_268] != local_204) {
              local_288 = local_288 * 0.0;
            }
            local_248 = local_60[(long)&(local_268->start_time_).__d.__r + local_f0] * local_288 *
                        pdVar14[(long)local_268] + local_248;
            local_250 = local_68[(long)&(local_268->start_time_).__d.__r + local_f0] * local_288 *
                        pdVar14[(long)local_268] + local_250;
            local_258 = local_70[(long)&(local_268->start_time_).__d.__r + local_f0] * local_288 *
                        pdVar14[(long)local_268] + local_258;
            local_260 = local_78[(long)&(local_268->start_time_).__d.__r + local_f0] * local_288 *
                        pdVar14[(long)local_268] + local_260;
          }
          local_28[lVar15] = local_248 + local_28[lVar15];
          local_30[lVar15] = local_250 + local_30[lVar15];
          local_38[lVar15] = local_258 + local_38[lVar15];
          local_40[lVar15] = local_260 + local_40[lVar15];
        }
      }
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffcc0);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcc0);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcc0);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcc0);
    local_c8 = local_c8 + 1;
  }
  Timer::stop(in_stack_fffffffffffffcc0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffcc0);
  return;
}

Assistant:

void BoundaryElement::upward_pass()
{
    timers_.upward_pass.start();

    const double* __restrict clusters_x_ptr   = interp_pts_.interp_x_ptr();
    const double* __restrict clusters_y_ptr   = interp_pts_.interp_y_ptr();
    const double* __restrict clusters_z_ptr   = interp_pts_.interp_z_ptr();
    
    double* __restrict clusters_q_ptr         = interp_charge_.data();
    double* __restrict clusters_q_dx_ptr      = interp_charge_dx_.data();
    double* __restrict clusters_q_dy_ptr      = interp_charge_dy_.data();
    double* __restrict clusters_q_dz_ptr      = interp_charge_dz_.data();
    
    const double* __restrict elements_x_ptr  = elements_.x_ptr();
    const double* __restrict elements_y_ptr  = elements_.y_ptr();
    const double* __restrict elements_z_ptr  = elements_.z_ptr();
    
    const double* __restrict sources_q_ptr    = elements_.source_charge_ptr();
    const double* __restrict sources_q_dx_ptr = elements_.source_charge_dx_ptr();
    const double* __restrict sources_q_dy_ptr = elements_.source_charge_dy_ptr();
    const double* __restrict sources_q_dz_ptr = elements_.source_charge_dz_ptr();
        
    std::vector<double> weights (interp_pts_.num_interp_pts_per_node());
    double* weights_ptr = weights.data();
    int weights_num = weights.size();
    
    for (int i = 0; i < weights_num; ++i) {
        weights[i] = ((i % 2 == 0)? 1 : -1);
        if (i == 0 || i == weights_num-1) weights[i] = ((i % 2 == 0)? 1 : -1) * 0.5;
    }

    int num_interp_pts_per_node = interp_pts_.num_interp_pts_per_node();
    
#ifdef OPENACC_ENABLED
    #pragma acc enter data copyin(weights_ptr[0:weights_num])
#endif
    
    for (std::size_t node_idx = 0; node_idx < tree_.num_nodes(); ++node_idx) {
        
        auto particle_idxs = tree_.node_particle_idxs(node_idx);
        
        std::size_t node_interp_pts_start = node_idx * interp_pts_.num_interp_pts_per_node();
        std::size_t node_charges_start    = node_idx * num_charges_per_node_;
        
        std::size_t particle_start = particle_idxs[0];
        std::size_t num_particles  = particle_idxs[1] - particle_idxs[0];
        
        std::vector<int> exact_idx_x(num_particles);
        std::vector<int> exact_idx_y(num_particles);
        std::vector<int> exact_idx_z(num_particles);
        std::vector<double> denominator(num_particles);
        
        int* exact_idx_x_ptr = exact_idx_x.data();
        int* exact_idx_y_ptr = exact_idx_y.data();
        int* exact_idx_z_ptr = exact_idx_z.data();
        double* denominator_ptr = denominator.data();
        
#ifdef OPENACC_ENABLED
    int stream_id = std::rand() % 3;
    #pragma acc kernels present(elements_x_ptr, elements_y_ptr, elements_z_ptr, \
                         sources_q_ptr, sources_q_dx_ptr, sources_q_dy_ptr, sources_q_dz_ptr, \
                         clusters_x_ptr, clusters_y_ptr, clusters_z_ptr, \
                         clusters_q_ptr, clusters_q_dx_ptr, clusters_q_dy_ptr, clusters_q_dz_ptr, \
                         weights_ptr) \
                  create(exact_idx_x_ptr[0:num_particles], exact_idx_y_ptr[0:num_particles], \
                         exact_idx_z_ptr[0:num_particles], denominator_ptr[0:num_particles])
#endif
        {

#ifdef OPENACC_ENABLED
        #pragma acc loop vector(32) independent
#endif
        for (std::size_t i = 0; i < num_particles; ++i) {
            exact_idx_x_ptr[i] = -1;
            exact_idx_y_ptr[i] = -1;
            exact_idx_z_ptr[i] = -1;
        }

#ifdef OPENACC_ENABLED
        #pragma acc loop independent
#endif
        for (std::size_t i = 0; i < num_particles; ++i) {
        
            double denominator_x = 0.;
            double denominator_y = 0.;
            double denominator_z = 0.;
            
            double xx    = elements_x_ptr[particle_start + i];
            double yy    = elements_y_ptr[particle_start + i];
            double zz    = elements_z_ptr[particle_start + i];

            // because there's a reduction over exact_idx[i], this loop carries a
            // backward dependence and won't actually parallelize
#ifdef OPENACC_ENABLED
            #pragma acc loop reduction(+:denominator_x,denominator_y,denominator_z)
#endif
            for (int j = 0; j < num_interp_pts_per_node; ++j) {
            
                double dist_x = xx - clusters_x_ptr[node_interp_pts_start + j];
                double dist_y = yy - clusters_y_ptr[node_interp_pts_start + j];
                double dist_z = zz - clusters_z_ptr[node_interp_pts_start + j];
                
                denominator_x += weights_ptr[j] / dist_x;
                denominator_y += weights_ptr[j] / dist_y;
                denominator_z += weights_ptr[j] / dist_z;
                
                if (std::abs(dist_x) < std::numeric_limits<double>::min()) exact_idx_x_ptr[i] = j;
                if (std::abs(dist_y) < std::numeric_limits<double>::min()) exact_idx_y_ptr[i] = j;
                if (std::abs(dist_z) < std::numeric_limits<double>::min()) exact_idx_z_ptr[i] = j;
            }
            
            denominator_ptr[i] = 1.0;
            if (exact_idx_x_ptr[i] == -1) denominator_ptr[i] /= denominator_x;
            if (exact_idx_y_ptr[i] == -1) denominator_ptr[i] /= denominator_y;
            if (exact_idx_z_ptr[i] == -1) denominator_ptr[i] /= denominator_z;
        }

#ifdef OPENACC_ENABLED
        #pragma acc loop collapse(3) independent
#endif
        for (int k1 = 0; k1 < num_interp_pts_per_node; ++k1) {
        for (int k2 = 0; k2 < num_interp_pts_per_node; ++k2) {
        for (int k3 = 0; k3 < num_interp_pts_per_node; ++k3) {
        
            std::size_t kk = node_charges_start
                   + k1 * num_interp_pts_per_node * num_interp_pts_per_node
                   + k2 * num_interp_pts_per_node + k3;
                   
            double cx = clusters_x_ptr[node_interp_pts_start + k1];
            double w1 = weights_ptr[k1];

            double cy = clusters_y_ptr[node_interp_pts_start + k2];
            double w2 = weights_ptr[k2];
            
            double cz = clusters_z_ptr[node_interp_pts_start + k3];
            double w3 = weights_ptr[k3];
            
            double q_temp    = 0.;
            double q_dx_temp = 0.;
            double q_dy_temp = 0.;
            double q_dz_temp = 0.;
            
#ifdef OPENACC_ENABLED
            #pragma acc loop reduction(+:q_temp,q_dx_temp,q_dy_temp,q_dz_temp)
#endif
            for (std::size_t i = 0; i < num_particles; i++) {  // loop over source points
            
                double dist_x = elements_x_ptr[particle_start + i] - cx;
                double dist_y = elements_y_ptr[particle_start + i] - cy;
                double dist_z = elements_z_ptr[particle_start + i] - cz;
                
                double numerator = 1.;

                // If exact_idx[i] == -1, then no issues.
                // If exact_idx[i] != -1, then we want to zero out terms EXCEPT when exactInd=k1.
                if (exact_idx_x_ptr[i] == -1) {
                    numerator *= w1 / dist_x;
                } else {
                    if (exact_idx_x_ptr[i] != k1) numerator *= 0.;
                }

                if (exact_idx_y_ptr[i] == -1) {
                    numerator *= w2 / dist_y;
                } else {
                    if (exact_idx_y_ptr[i] != k2) numerator *= 0.;
                }

                if (exact_idx_z_ptr[i] == -1) {
                    numerator *= w3 / dist_z;
                } else {
                    if (exact_idx_z_ptr[i] != k3) numerator *= 0.;
                }

                q_temp    += sources_q_ptr   [particle_start + i] * numerator * denominator_ptr[i];
                q_dx_temp += sources_q_dx_ptr[particle_start + i] * numerator * denominator_ptr[i];
                q_dy_temp += sources_q_dy_ptr[particle_start + i] * numerator * denominator_ptr[i];
                q_dz_temp += sources_q_dz_ptr[particle_start + i] * numerator * denominator_ptr[i];
            }
            
            clusters_q_ptr   [kk] += q_temp;
            clusters_q_dx_ptr[kk] += q_dx_temp;
            clusters_q_dy_ptr[kk] += q_dy_temp;
            clusters_q_dz_ptr[kk] += q_dz_temp;
        }
        }
        }
        
        } // end parallel region
    } // end loop over nodes
#ifdef OPENACC_ENABLED
    #pragma acc exit data delete(weights_ptr[0:weights_num])
#endif

    timers_.upward_pass.stop();
}